

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

int lest::run<1ul>(test (*specification) [1],int argc,char **argv,ostream *os)

{
  int iVar1;
  allocator_type local_4a;
  allocator_type local_49;
  texts local_48;
  tests local_30;
  
  std::vector<lest::test,std::allocator<lest::test>>::vector<lest::test_const*,void>
            ((vector<lest::test,std::allocator<lest::test>> *)&local_30,*specification,
             specification[1],&local_49);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::vector<char**,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_48,argv + 1
             ,argv + argc,&local_4a);
  iVar1 = run(&local_30,&local_48,os);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  std::vector<lest::test,_std::allocator<lest::test>_>::~vector(&local_30);
  return iVar1;
}

Assistant:

int run( test const (&specification)[N], int argc, char * argv[], std::ostream & os = std::cout )
{
    return run( tests( specification, specification + N ), texts( argv + 1, argv + argc ), os  );
}